

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

void __thiscall
Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::
Bitfield_encoding(Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_> *this,
                 vertex_t n,dimension_t k)

{
  int iVar1;
  overflow_error *this_00;
  long *plVar2;
  uint uVar3;
  size_type *psVar4;
  long *plVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = 0;
  if (1 < n) {
    iVar1 = 0;
    uVar6 = (ulong)(n - 1);
    do {
      iVar1 = iVar1 + 1;
      uVar3 = (uint)uVar6;
      uVar6 = uVar6 >> 1;
    } while (1 < uVar3);
  }
  this->bits_per_vertex = iVar1;
  iVar1 = iVar1 * k;
  this->extra_bits = 0x40 - iVar1;
  if (iVar1 < 0x41) {
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_b0,k + -1);
  std::operator+(&local_90,"cannot encode all simplices of dimension ",&local_b0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_150._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_150._M_dataplus._M_p == psVar4) {
    local_150.field_2._M_allocated_capacity = *psVar4;
    local_150.field_2._8_8_ = plVar2[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar4;
  }
  local_150._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_d0,n);
  std::operator+(&local_70,&local_150,&local_d0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_130._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar4) {
    local_130.field_2._M_allocated_capacity = *psVar4;
    local_130.field_2._8_8_ = plVar2[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar4;
  }
  local_130._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_f0,0x40);
  std::operator+(&local_50,&local_130,&local_f0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_110 = (long *)*plVar2;
  plVar5 = plVar2 + 2;
  if (local_110 == plVar5) {
    local_100 = *plVar5;
    lStack_f8 = plVar2[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar5;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::overflow_error::overflow_error(this_00,(string *)&local_110);
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

Bitfield_encoding(vertex_t n, dimension_t k) : bits_per_vertex(log2up(n)) {
      static_assert(std::numeric_limits<simplex_t>::radix == 2);
      const int available_bits = std::numeric_limits<simplex_t>::digits;
      extra_bits = available_bits - bits_per_vertex * k;
      if (extra_bits < 0)
        throw std::overflow_error("cannot encode all simplices of dimension " + std::to_string(k - 1) + " with " + std::to_string(n) + " vertices using only " + std::to_string(available_bits) + " bits");
      // The message is a bit misleading, it is tuples that we cannot encode, and just with this representation.
    }